

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O3

void test_ack_decode(void)

{
  ulong uVar1;
  int iVar2;
  uint8_t **end;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  uint8_t pat [4];
  uint8_t *src;
  quicly_ack_frame_t decoded;
  undefined8 local_1468;
  uint8_t **local_1460;
  uint8_t *local_1458;
  uint8_t *local_1450 [127];
  quicly_ack_frame_t local_1058;
  
  local_1458 = (uint8_t *)&local_1468;
  local_1468 = (uint8_t **)CONCAT44(local_1468._4_4_,0x11000034);
  uVar4 = 0;
  iVar2 = quicly_decode_ack_frame(&local_1458,(uint8_t *)((long)&local_1468 + 4),&local_1058,0);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x45)
  ;
  _ok((uint)(local_1458 == (uint8_t *)((long)&local_1468 + 4)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x46)
  ;
  _ok((uint)(local_1058.largest_acknowledged == 0x34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x47)
  ;
  _ok((uint)(local_1058.num_gaps == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x48)
  ;
  _ok((uint)(local_1058.ack_block_lengths[0] == 0x12),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x49)
  ;
  _ok((uint)(local_1058.smallest_acknowledged == 0x23),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c");
  local_1458 = (uint8_t *)0x403020100020034;
  end = local_1450;
  local_1468 = &local_1458;
  iVar2 = quicly_decode_ack_frame((uint8_t **)&local_1468,(uint8_t *)end,&local_1058,0);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x50)
  ;
  _ok((uint)(local_1468 == end),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x51)
  ;
  _ok((uint)(local_1058.largest_acknowledged == 0x34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x52)
  ;
  _ok((uint)(local_1058.num_gaps == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x53)
  ;
  _ok((uint)(local_1058.ack_block_lengths[0] == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x54)
  ;
  _ok((uint)(local_1058.gaps[0] == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x55)
  ;
  _ok((uint)(local_1058.ack_block_lengths[1] == 3),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x56)
  ;
  _ok((uint)(local_1058.gaps[1] == 4),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x57)
  ;
  _ok((uint)(local_1058.ack_block_lengths[2] == 5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x58)
  ;
  _ok((uint)(local_1058.smallest_acknowledged == 0x26),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c");
  local_1468 = &local_1458;
  local_1458 = (uint8_t *)0x81e410000fa0080;
  do {
    if (0x3f < uVar4) {
      *(byte *)end = (byte)(uVar4 >> 8) | 0x40;
      end = (uint8_t **)((long)end + 1);
    }
    *(char *)end = (char)uVar4;
    *(byte *)((long)end + 1) = ((byte)(((uint)uVar4 & 0xffff) / 5) & 0xfe) * -5 + (char)uVar4;
    end = (uint8_t **)((long)end + 2);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x11e);
  local_1460 = end;
  iVar2 = quicly_decode_ack_frame((uint8_t **)&local_1468,(uint8_t *)end,&local_1058,0);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6a)
  ;
  _ok((uint)(local_1058.largest_acknowledged == 64000),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6b)
  ;
  _ok((uint)(local_1058.ack_delay == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6c)
  ;
  _ok((uint)(local_1058.num_gaps == 0x100),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6d)
  ;
  _ok((uint)(local_1058.ack_block_lengths[0] == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6e)
  ;
  uVar3 = local_1058.ack_block_lengths[0];
  if (local_1058.num_gaps != 0) {
    lVar5 = 1;
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      _ok((uint)(uVar1 == local_1058.gaps[uVar4]),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",
          0x71);
      _ok((uint)(lVar5 + (uVar4 / 5 & 0xfffffffffffffffe) * -5 ==
                local_1058.ack_block_lengths[uVar4 + 1]),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",
          0x72);
      uVar3 = uVar3 + local_1058.gaps[uVar4] + local_1058.ack_block_lengths[uVar4 + 1];
      lVar5 = lVar5 + 1;
      uVar4 = uVar1;
    } while (uVar1 < local_1058.num_gaps);
  }
  _ok((uint)(local_1468 == local_1460),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x75)
  ;
  _ok((uint)(local_1058.smallest_acknowledged == 0xfa01 - uVar3),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x76)
  ;
  subtest("underflow",test_ack_decode_underflow);
  return;
}

Assistant:

static void test_ack_decode(void)
{
    {
        const uint8_t pat[] = {0x34, 0x00, 0x00, 0x11}, *src = pat;
        quicly_ack_frame_t decoded;
        ok(quicly_decode_ack_frame(&src, pat + sizeof(pat), &decoded, 0) == 0);
        ok(src == pat + sizeof(pat));
        ok(decoded.largest_acknowledged == 0x34);
        ok(decoded.num_gaps == 0);
        ok(decoded.ack_block_lengths[0] == 0x12);
        ok(decoded.smallest_acknowledged == 0x34 - 0x12 + 1);
    }

    {
        const uint8_t pat[] = {0x34, 0x00, 0x02, 0x00, 0x01, 0x02, 0x03, 0x04}, *src = pat;
        quicly_ack_frame_t decoded;
        ok(quicly_decode_ack_frame(&src, pat + sizeof(pat), &decoded, 0) == 0);
        ok(src == pat + sizeof(pat));
        ok(decoded.largest_acknowledged == 0x34);
        ok(decoded.num_gaps == 2);
        ok(decoded.ack_block_lengths[0] == 1);
        ok(decoded.gaps[0] == 2);
        ok(decoded.ack_block_lengths[1] == 3);
        ok(decoded.gaps[1] == 4);
        ok(decoded.ack_block_lengths[2] == 5);
        ok(decoded.smallest_acknowledged == 0x34 - 1 - 2 - 3 - 4 - 5 + 1);
    }

    { /* Bogus ACK Frame larger than the internal buffer */
        uint8_t pat[1024], *end = pat;
        const uint8_t *src = pat;
        uint64_t i, range_sum;
        quicly_ack_frame_t decoded;
        end = quicly_encodev(end, 0xFA00);
        end = quicly_encodev(end, 0);
        end = quicly_encodev(end, QUICLY_ACK_MAX_GAPS + 30); // with excess ranges
        end = quicly_encodev(end, 8);
        for (i = 0; i < QUICLY_ACK_MAX_GAPS + 30; ++i) {
            end = quicly_encodev(end, i);      // gap
            end = quicly_encodev(end, i % 10); // ack-range
        }

        ok(quicly_decode_ack_frame(&src, end, &decoded, 0) == 0);
        ok(decoded.largest_acknowledged == 0xFA00);
        ok(decoded.ack_delay == 0);
        ok(decoded.num_gaps == QUICLY_ACK_MAX_GAPS);
        ok(decoded.ack_block_lengths[0] == 8 + 1); // first ack-range
        range_sum = decoded.ack_block_lengths[0];
        for (i = 0; i < decoded.num_gaps; ++i) {
            ok(decoded.gaps[i] == i + 1);
            ok(decoded.ack_block_lengths[i + 1] == (i % 10) + 1);
            range_sum += decoded.gaps[i] + decoded.ack_block_lengths[i + 1];
        }
        ok(src == end); // decoded the entire frame
        ok(decoded.smallest_acknowledged == 0xFA00 - range_sum + 1);
    }

    subtest("underflow", test_ack_decode_underflow);
}